

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Option<Catch::TestRunInfo> * __thiscall
Catch::Option<Catch::TestRunInfo>::operator=(Option<Catch::TestRunInfo> *this,TestRunInfo *_value)

{
  reset(this);
  std::__cxx11::string::string((string *)this->storage,(string *)_value);
  this->nullableValue = (TestRunInfo *)this->storage;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }